

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

adh_node_t * adh_create_node_and_append(adh_symbol_t symbol)

{
  adh_node_t *node;
  adh_node_t *node_00;
  adh_node_t *newNYT;
  adh_node_t *newNode;
  adh_symbol_t symbol_local;
  
  node = create_node(symbol);
  if (node != (adh_node_t *)0x0) {
    increase_weight(node);
    node->parent = adh_nyt_node;
    adh_nyt_node->right = node;
    node_00 = create_nyt();
    node_00->parent = adh_nyt_node;
    adh_nyt_node->left = node_00;
    adh_nyt_node = node_00;
    node_00->parent->symbol = -2;
    update_node_encoding(node);
    update_node_encoding(node_00);
  }
  return node;
}

Assistant:

adh_node_t * adh_create_node_and_append(adh_symbol_t symbol) {
#ifdef _DEBUG
    log_trace("    adh_create_node_and_append", "%s (1,%d)\n", fmt_symbol(symbol), adh_next_order);
#endif

    // IMPORTANT: right node must be created before left node because
    //            create_node() decrease adh_next_order each time it's called

    // create right leaf node with passed symbol (and weight 1)
    adh_node_t * newNode = create_node(symbol);
    if(newNode) {
        increase_weight(newNode);
        newNode->parent = adh_nyt_node;
        adh_nyt_node->right = newNode;

        // create left leaf node with no symbol
        adh_node_t * newNYT = create_nyt();
        newNYT->parent = adh_nyt_node;
        adh_nyt_node->left = newNYT;

        // the new left node is the new NYT node
        adh_nyt_node = newNYT;
        // reset old NYT symbol, since is not a NYT anymore
        newNYT->parent->symbol = ADH_OLD_NYT_CODE;

        update_node_encoding(newNode);  // update bit_array
        update_node_encoding(newNYT);    // update bit_array
    }
    return newNode;
}